

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O2

bool google::protobuf::util::anon_unknown_0::FieldInOneof
               (Type *type,string_view name,string_view oneof_name)

{
  int iVar1;
  bool bVar2;
  Field *pFVar3;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar4;
  string_view name_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  
  name_00._M_str = (char *)oneof_name._M_len;
  name_00._M_len = name._M_str;
  pFVar3 = FindField((anon_unknown_0 *)type,(Type *)name._M_len,name_00);
  if (((pFVar3 != (Field *)0x0) && (iVar1 = (pFVar3->field_0)._impl_.oneof_index_, 0 < iVar1)) &&
     (iVar1 <= *(int *)((long)&type->field_0 + 0x28))) {
    pVVar4 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                       (&(type->field_0)._impl_.oneofs_.super_RepeatedPtrFieldBase,iVar1 + -1);
    __x._M_str = (pVVar4->_M_dataplus)._M_p;
    __x._M_len = pVVar4->_M_string_length;
    bVar2 = std::operator==(__x,oneof_name);
    return bVar2;
  }
  return false;
}

Assistant:

bool FieldInOneof(const Type& type, absl::string_view name,
                  absl::string_view oneof_name) {
  const Field* field = FindField(type, name);
  if (field == nullptr || field->oneof_index() <= 0 ||
      field->oneof_index() > type.oneofs_size()) {
    return false;
  }
  return type.oneofs(field->oneof_index() - 1) == oneof_name;
}